

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper>
               (XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper *testObject,
               TestDetails *details)

{
  XmlTestReporter *this;
  TestResults *pTVar1;
  char *pcVar2;
  int iVar3;
  TestDetails **ppTVar4;
  TestResults **ppTVar5;
  undefined8 *puVar6;
  TestDetails details_1;
  SignalTranslator sig;
  TestDetails local_4d0;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar4 = CurrentTest::Details();
  *ppTVar4 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar3 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar3 == 0) {
    TestDetails::TestDetails(&local_4b0,"","","",0);
    this = &(testObject->super_XmlTestReporterFixture).reporter;
    DeferredTestReporter::ReportTestStart(&this->super_DeferredTestReporter,&local_4b0);
    DeferredTestReporter::ReportFailure(&this->super_DeferredTestReporter,&local_4b0,"message");
    DeferredTestReporter::ReportTestFinish(&this->super_DeferredTestReporter,&local_4b0,1.0);
    std::__cxx11::stringbuf::str();
    pcVar2 = local_4d0.testName;
    if ((char **)local_4d0.suiteName != &local_4d0.filename) {
      operator_delete(local_4d0.suiteName,(ulong)(local_4d0.filename + 1));
    }
    if (pcVar2 != (char *)0x0) {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4d0,*ppTVar4,0x3e);
      TestResults::OnTestFailure(pTVar1,&local_4d0,"output.str().empty()");
    }
    XmlTestReporter::ReportSummary(this,1,1,1,1.0);
    std::__cxx11::stringbuf::str();
    if ((char **)local_4d0.suiteName != &local_4d0.filename) {
      operator_delete(local_4d0.suiteName,(ulong)(local_4d0.filename + 1));
    }
    if (local_4d0.testName == (char *)0x0) {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4d0,*ppTVar4,0x41);
      TestResults::OnTestFailure(pTVar1,&local_4d0,"!output.str().empty()");
    }
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Unhandled system exception";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}